

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

int Bac_ObjAlloc(Bac_Ntk_t *p,Bac_ObjType_t Type,int Fanin)

{
  int Entry;
  int iVar1;
  int iObj;
  int Fanin_local;
  Bac_ObjType_t Type_local;
  Bac_Ntk_t *p_local;
  
  Entry = Bac_NtkObjNum(p);
  iVar1 = Vec_IntSize(&p->vFanin);
  if (Entry != iVar1) {
    __assert_fail("iObj == Vec_IntSize(&p->vFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                  ,0x19f,"int Bac_ObjAlloc(Bac_Ntk_t *, Bac_ObjType_t, int)");
  }
  if (Type == BAC_OBJ_PI) {
    Vec_IntPush(&p->vInputs,Entry);
  }
  else if (Type == BAC_OBJ_PO) {
    Vec_IntPush(&p->vOutputs,Entry);
  }
  iVar1 = Abc_Var2Lit(Type,0);
  Vec_StrPush(&p->vType,(char)iVar1);
  Vec_IntPush(&p->vFanin,Fanin);
  return Entry;
}

Assistant:

static inline int Bac_ObjAlloc( Bac_Ntk_t * p, Bac_ObjType_t Type, int Fanin )
{
    int iObj = Bac_NtkObjNum(p);
    assert( iObj == Vec_IntSize(&p->vFanin) );
    if ( Type == BAC_OBJ_PI )
        Vec_IntPush( &p->vInputs, iObj );
    else if ( Type == BAC_OBJ_PO )
        Vec_IntPush( &p->vOutputs, iObj );
    Vec_StrPush( &p->vType, (char)Abc_Var2Lit(Type, 0) );
    Vec_IntPush( &p->vFanin, Fanin );
    return iObj;
}